

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

void __thiscall HydEngine::~HydEngine(HydEngine *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  std::__cxx11::string::~string((string *)&this->timeStepReason);
  return;
}

Assistant:

HydEngine::~HydEngine()
{
    close();

//    cout << "\nHydEngine destructed.\n";
}